

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O2

void __thiscall phosg::Subprocess::Subprocess(Subprocess *this)

{
  this->stdin_write_fd = -1;
  this->stdout_read_fd = -1;
  this->stderr_read_fd = -1;
  this->child_pid = -1;
  this->terminated = false;
  this->exit_status = -1;
  return;
}

Assistant:

Subprocess::Subprocess()
    : stdin_write_fd(-1),
      stdout_read_fd(-1),
      stderr_read_fd(-1),
      child_pid(-1),
      terminated(false),
      exit_status(-1) {}